

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

void produce<long,disruptor::MultiThreadedStrategyEx,disruptor::YieldingStrategy<200l>>
               (Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::YieldingStrategy<200L>,_0>
                *s)

{
  uint uVar1;
  pointer plVar2;
  ulong in_RAX;
  int k;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int64_t sequence;
  ulong local_28;
  
  lVar5 = 0;
  local_28 = in_RAX;
  lVar6 = RING_BUFFER_SIZE * counter;
  if ((long)(RING_BUFFER_SIZE * counter) < 1) {
    lVar6 = lVar5;
  }
  for (; lVar5 != lVar6; lVar5 = lVar5 + 1) {
    local_28 = disruptor::
               Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::YieldingStrategy<200L>,_0>
               ::Claim(s,delta);
    uVar1 = (s->ring_buffer_).index_mask_;
    if (local_28 < delta) {
      plVar2 = (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar3 = 0; lVar3 <= (long)local_28; lVar3 = lVar3 + 1) {
        plVar2[(uint)lVar3 & uVar1] = lVar3;
      }
    }
    else {
      plVar2 = (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar4 = local_28; local_28 - delta < uVar4; uVar4 = uVar4 - 1) {
        plVar2[uVar4 & (long)(int)uVar1] = uVar4;
      }
    }
    disruptor::
    Sequencer<long,_disruptor::MultiThreadedStrategyEx,_disruptor::YieldingStrategy<200L>,_0>::
    Publish(s,(int64_t *)&local_28,delta);
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {
    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}